

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O3

UBool __thiscall
icu_63::AnnualTimeZoneRule::isEquivalentTo(AnnualTimeZoneRule *this,TimeZoneRule *other)

{
  char *__s1;
  char *__s2;
  UBool UVar1;
  int iVar2;
  
  if (this == (AnnualTimeZoneRule *)other) {
    return '\x01';
  }
  __s1 = *(char **)((this->super_TimeZoneRule).super_UObject._vptr_UObject[-1] + 8);
  __s2 = *(char **)((other->super_UObject)._vptr_UObject[-1] + 8);
  if ((((__s1 == __s2) || ((*__s1 != '*' && (iVar2 = strcmp(__s1,__s2), iVar2 == 0)))) &&
      (UVar1 = TimeZoneRule::isEquivalentTo(&this->super_TimeZoneRule,other), UVar1 != '\0')) &&
     ((UVar1 = DateTimeRule::operator==
                         (this->fDateTimeRule,(DateTimeRule *)other[1].super_UObject._vptr_UObject),
      UVar1 != '\0' &&
      (this->fStartYear == *(int *)&other[1].fName.super_Replaceable.super_UObject._vptr_UObject))))
  {
    return this->fEndYear ==
           *(int *)((long)&other[1].fName.super_Replaceable.super_UObject._vptr_UObject + 4);
  }
  return '\0';
}

Assistant:

UBool
AnnualTimeZoneRule::isEquivalentTo(const TimeZoneRule& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (typeid(*this) != typeid(other) || TimeZoneRule::isEquivalentTo(other) == FALSE) {
        return FALSE;
    }
    AnnualTimeZoneRule* that = (AnnualTimeZoneRule*)&other;
    return (*fDateTimeRule == *(that->fDateTimeRule) &&
            fStartYear == that->fStartYear &&
            fEndYear == that->fEndYear);
}